

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::BackgroundZeroQueuedPages(HeapInfo *this)

{
  HeapInfo *this_local;
  
  ForEachNonLeafPageAllocator<Memory::HeapInfo::BackgroundZeroQueuedPages()::__0>(this);
  return;
}

Assistant:

void
HeapInfo::BackgroundZeroQueuedPages()
{
    ForEachNonLeafPageAllocator([](IdleDecommitPageAllocator * pageAlloc)
    {
        pageAlloc->BackgroundZeroQueuedPages();
    });
}